

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O2

UtcTimeStamp *
FIX::UtcTimeStampConvertor::convert(UtcTimeStamp *__return_storage_ptr__,string *value)

{
  char *pcVar1;
  int minute;
  size_type sVar2;
  char *pcVar3;
  FieldConvertError *this;
  int second;
  long lVar4;
  size_type sVar5;
  int hour;
  int fraction;
  int date;
  int month;
  int year;
  
  sVar2 = value->_M_string_length;
  if (sVar2 - 0x1c < 0xfffffffffffffff5) {
    this = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(this,value);
  }
  else {
    pcVar3 = (value->_M_dataplus)._M_p;
    lVar4 = 0;
    do {
      if (lVar4 == 8) {
        if (pcVar3[8] != '-') {
          this = (FieldConvertError *)__cxa_allocate_exception(0x50);
          FieldConvertError::FieldConvertError(this,value);
          goto LAB_001787a4;
        }
        lVar4 = 9;
        goto LAB_00178546;
      }
      pcVar1 = pcVar3 + lVar4;
      lVar4 = lVar4 + 1;
    } while ((int)*pcVar1 - 0x30U < 10);
    this = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(this,value);
  }
  goto LAB_001787a4;
  while (pcVar1 = pcVar3 + lVar4, lVar4 = lVar4 + 1, (int)*pcVar1 - 0x30U < 10) {
LAB_00178546:
    if (lVar4 == 0xb) {
      if (pcVar3[0xb] != ':') {
        this = (FieldConvertError *)__cxa_allocate_exception(0x50);
        FieldConvertError::FieldConvertError(this,value);
        goto LAB_001787a4;
      }
      lVar4 = 0xc;
      goto LAB_00178585;
    }
  }
  this = (FieldConvertError *)__cxa_allocate_exception(0x50);
  FieldConvertError::FieldConvertError(this,value);
  goto LAB_001787a4;
  while (pcVar1 = pcVar3 + lVar4, lVar4 = lVar4 + 1, (int)*pcVar1 - 0x30U < 10) {
LAB_00178585:
    if (lVar4 == 0xe) {
      if (pcVar3[0xe] != ':') {
        this = (FieldConvertError *)__cxa_allocate_exception(0x50);
        FieldConvertError::FieldConvertError(this,value);
        goto LAB_001787a4;
      }
      lVar4 = 0xf;
      goto LAB_001785c4;
    }
  }
  this = (FieldConvertError *)__cxa_allocate_exception(0x50);
  FieldConvertError::FieldConvertError(this,value);
  goto LAB_001787a4;
  while (pcVar1 = pcVar3 + lVar4, lVar4 = lVar4 + 1, (int)*pcVar1 - 0x30U < 10) {
LAB_001785c4:
    if (lVar4 == 0x11) {
      if ((pcVar3[4] * 10 + (int)pcVar3[5]) - 0x21dU < 0xfffffff4) {
        this = (FieldConvertError *)__cxa_allocate_exception(0x50);
        FieldConvertError::FieldConvertError(this,value);
      }
      else if ((pcVar3[6] * 10 + (int)pcVar3[7]) - 0x230U < 0xffffffe1) {
        this = (FieldConvertError *)__cxa_allocate_exception(0x50);
        FieldConvertError::FieldConvertError(this,value);
      }
      else if (pcVar3[9] * 10 + (int)pcVar3[10] + -0x1e0 < 0x48) {
        if (pcVar3[0xc] * 10 + -0x1e0 + (int)pcVar3[0xd] < 0x6c) {
          if (pcVar3[0xf] * 10 + (int)pcVar3[0x10] + -0x1e0 < 0x6d) {
            year = ((int)pcVar3[2] + ((int)pcVar3[1] + *pcVar3 * 10) * 10) * 10 + (int)pcVar3[3] +
                   -0xd050;
            month = pcVar3[4] * 10 + -0x210 + (int)pcVar3[5];
            date = pcVar3[6] * 10 + -0x210 + (int)pcVar3[7];
            hour = pcVar3[9] * 10 + (int)pcVar3[10] + -0x210;
            minute = pcVar3[0xc] * 10 + -0x210 + (int)pcVar3[0xd];
            second = pcVar3[0xf] * 10 + (int)pcVar3[0x10] + -0x210;
            if (sVar2 == 0x11) {
              UtcTimeStamp::UtcTimeStamp
                        (__return_storage_ptr__,hour,minute,second,0,date,month,year);
              return __return_storage_ptr__;
            }
            if (pcVar3[0x11] == '.') {
              fraction = 0;
              sVar5 = 0x12;
              while( true ) {
                if (sVar2 == sVar5) {
                  UtcTimeStamp::UtcTimeStamp
                            (__return_storage_ptr__,hour,minute,second,fraction,date,month,year,
                             (int)sVar2 + -0x12);
                  return __return_storage_ptr__;
                }
                if (9 < (int)pcVar3[sVar5] - 0x30U) break;
                fraction = fraction * 10 + (int)pcVar3[sVar5] + -0x30;
                sVar5 = sVar5 + 1;
              }
              this = (FieldConvertError *)__cxa_allocate_exception(0x50);
              FieldConvertError::FieldConvertError(this,value);
            }
            else {
              this = (FieldConvertError *)__cxa_allocate_exception(0x50);
              FieldConvertError::FieldConvertError(this,value);
            }
          }
          else {
            this = (FieldConvertError *)__cxa_allocate_exception(0x50);
            FieldConvertError::FieldConvertError(this,value);
          }
        }
        else {
          this = (FieldConvertError *)__cxa_allocate_exception(0x50);
          FieldConvertError::FieldConvertError(this,value);
        }
      }
      else {
        this = (FieldConvertError *)__cxa_allocate_exception(0x50);
        FieldConvertError::FieldConvertError(this,value);
      }
      goto LAB_001787a4;
    }
  }
  this = (FieldConvertError *)__cxa_allocate_exception(0x50);
  FieldConvertError::FieldConvertError(this,value);
LAB_001787a4:
  __cxa_throw(this,&FieldConvertError::typeinfo,Exception::~Exception);
}

Assistant:

EXCEPT(FieldConvertError) {
    size_t length = value.size();
    if (length < 17 || length > 27) {
      throw FieldConvertError(value);
    }

    size_t i = 0;
    int c = 0;
    for (c = 0; c < 8; ++c) {
      if (!IS_DIGIT(value[i++])) {
        throw FieldConvertError(value);
      }
    }
    if (value[i++] != '-') {
      throw FieldConvertError(value);
    }
    for (c = 0; c < 2; ++c) {
      if (!IS_DIGIT(value[i++])) {
        throw FieldConvertError(value);
      }
    }
    if (value[i++] != ':') {
      throw FieldConvertError(value);
    }
    for (c = 0; c < 2; ++c) {
      if (!IS_DIGIT(value[i++])) {
        throw FieldConvertError(value);
      }
    }
    if (value[i++] != ':') {
      throw FieldConvertError(value);
    }
    for (c = 0; c < 2; ++c) {
      if (!IS_DIGIT(value[i++])) {
        throw FieldConvertError(value);
      }
    }

    int year, mon, mday, hour, min, sec;

    i = 0;

    year = value[i++] - '0';
    year = 10 * year + value[i++] - '0';
    year = 10 * year + value[i++] - '0';
    year = 10 * year + value[i++] - '0';

    mon = value[i++] - '0';
    mon = 10 * mon + value[i++] - '0';
    if (mon < 1 || 12 < mon) {
      throw FieldConvertError(value);
    }

    mday = value[i++] - '0';
    mday = 10 * mday + value[i++] - '0';
    if (mday < 1 || 31 < mday) {
      throw FieldConvertError(value);
    }

    ++i; // skip '-'

    hour = value[i++] - '0';
    hour = 10 * hour + value[i++] - '0';
    // No check for >= 0 as no '-' are converted here
    if (23 < hour) {
      throw FieldConvertError(value);
    }

    ++i; // skip ':'

    min = value[i++] - '0';
    min = 10 * min + value[i++] - '0';
    // No check for >= 0 as no '-' are converted here
    if (59 < min) {
      throw FieldConvertError(value);
    }

    ++i; // skip ':'

    sec = value[i++] - '0';
    sec = 10 * sec + value[i++] - '0';

    // No check for >= 0 as no '-' are converted here
    if (60 < sec) {
      throw FieldConvertError(value);
    }

    if (length == 17) {
      return UtcTimeStamp(hour, min, sec, 0, mday, mon, year);
    }

    if (value[i++] != '.') {
      throw FieldConvertError(value);
    }

    int fraction = 0;
    for (; i < length; ++i) {
      char ch = value[i];
      if (!IS_DIGIT(ch)) {
        throw FieldConvertError(value);
      }
      fraction = (fraction * 10) + ch - '0';
    }

    return UtcTimeStamp(hour, min, sec, fraction, mday, mon, year, static_cast<int>(length - 17 - 1));
  }